

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O3

void __thiscall MinVR::VRDisplayNode::~VRDisplayNode(VRDisplayNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppVVar3;
  
  this->_vptr_VRDisplayNode = (_func_int **)&PTR__VRDisplayNode_00177598;
  clearChildren(this,true);
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::_M_clear(&(this->_valuesNeeded).
              super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&(this->_valuesAdded).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  pcVar2 = (this->_name)._M_dataplus._M_p;
  paVar1 = &(this->_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ppVVar3 = (this->_children).
            super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppVVar3 != (pointer)0x0) {
    operator_delete(ppVVar3,(long)(this->_children).
                                  super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar3
                   );
    return;
  }
  return;
}

Assistant:

VRDisplayNode::~VRDisplayNode() {
	clearChildren(true);
}